

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

bool __thiscall
FxVMFunctionCall::CheckEmitCast
          (FxVMFunctionCall *this,VMFunctionBuilder *build,bool returnit,ExpEmit *reg)

{
  uint uVar1;
  FxExpression *pFVar2;
  PString *pPVar3;
  int iVar4;
  uint uVar5;
  ExpEmit EVar6;
  uint extraout_var_00;
  uint opb;
  FString local_38;
  undefined4 extraout_var;
  
  uVar5 = *(uint *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
  uVar1 = uVar5 - 0x274;
  if (uVar1 < 3) {
    pFVar2 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    if (returnit) {
      iVar4 = (*pFVar2->_vptr_FxExpression[3])(pFVar2);
      if (((uVar5 & 0x276) == 0x274) && ((char)iVar4 != '\0')) {
        pPVar3 = (PString *)pFVar2[1]._vptr_FxExpression;
        if (pPVar3 == TypeString) {
          FString::AttachToOther(&local_38,&pFVar2[1].ScriptPosition.FileName);
        }
        else {
          local_38.Chars = pFVar2[1].ScriptPosition.FileName.Chars;
        }
        VMFunctionBuilder::EmitRetInt(build,0,true,(int)local_38.Chars);
        if (pPVar3 == TypeString) {
          FString::~FString(&local_38);
        }
      }
      else {
        uVar5 = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
        opb = uVar5 >> 0x10 & 0xff;
        if ((extraout_var_00 & 1) == 0) {
          if ((char)(uVar5 >> 0x18) == '\x03') {
            opb = opb | 0x10;
          }
          else if (uVar5 >> 0x18 == 2) {
            opb = opb | 8;
          }
        }
        else {
          opb = opb | 4;
        }
        VMFunctionBuilder::Emit(build,0x4e,0x80,opb,uVar5 & 0xffff);
        if ((CONCAT44(extraout_var_00,uVar5) & 0x10100fc0000) == 0) {
          VMFunctionBuilder::RegAvailability::Return
                    (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar5) >> 0x10) & 3),
                     uVar5 & 0xffff,uVar5 >> 0x18);
        }
      }
      reg->RegNum = 0;
      reg->RegType = 0x80;
      reg->RegCount = '\x01';
      reg->Konst = false;
      reg->Fixed = false;
      reg->Final = false;
      reg->Target = false;
      reg->Final = true;
    }
    else {
      EVar6._0_4_ = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
      EVar6.Konst = (bool)(char)extraout_var;
      EVar6.Fixed = (bool)(char)((uint)extraout_var >> 8);
      EVar6.Final = (bool)(char)((uint)extraout_var >> 0x10);
      EVar6.Target = (bool)(char)((uint)extraout_var >> 0x18);
      *reg = EVar6;
    }
  }
  return uVar1 < 3;
}

Assistant:

bool FxVMFunctionCall::CheckEmitCast(VMFunctionBuilder *build, bool returnit, ExpEmit &reg)
{
	FName funcname = Function->SymbolName;
	if (funcname == NAME___decorate_internal_int__ ||
		funcname == NAME___decorate_internal_bool__ ||
		funcname == NAME___decorate_internal_float__)
	{
		FxExpression *arg = ArgList[0];
		if (returnit)
		{
			if (arg->isConstant() &&
				(funcname == NAME___decorate_internal_int__ ||
				 funcname == NAME___decorate_internal_bool__))
			{ // Use immediate version for integers in range
				build->EmitRetInt(0, true, static_cast<FxConstant *>(arg)->GetValue().Int);
			}
			else
			{
				ExpEmit where = arg->Emit(build);
				build->Emit(OP_RET, RET_FINAL, EncodeRegType(where), where.RegNum);
				where.Free(build);
			}
			reg = ExpEmit();
			reg.Final = true;
		}
		else
		{
			reg = arg->Emit(build);
		}
		return true;
	}
	return false;
}